

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

double nonius::detail::
       standard_deviation<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  _Var1._M_current = first._M_current;
  if (first._M_current != last._M_current) {
    do {
      dVar3 = dVar3 + *_Var1._M_current;
      _Var1._M_current = _Var1._M_current + 1;
    } while (_Var1._M_current != last._M_current);
  }
  dVar4 = (double)((long)last._M_current - (long)first._M_current >> 3);
  if (last._M_current != first._M_current) {
    dVar2 = 0.0;
    do {
      dVar5 = *first._M_current - dVar3 / dVar4;
      dVar2 = dVar2 + dVar5 * dVar5;
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return SQRT(dVar2 / dVar4);
}

Assistant:

double standard_deviation(Iterator first, Iterator last) {
            auto m = mean(first, last);
            double variance = std::accumulate(first, last, 0., [m](double a, double b) {
                        double diff = b - m;
                        return a + diff*diff;
                    }) / (last - first);
            return std::sqrt(variance);
        }